

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

clock_t __thiscall lest::times::~times(times *this,tms *__buffer)

{
  ostream *poVar1;
  clock_t extraout_RAX;
  double dVar2;
  
  poVar1 = std::operator<<((this->super_action).os,"Elapsed time: ");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 1;
  dVar2 = timer::elapsed_seconds(&this->total);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar1," s\n");
  env::~env(&this->output);
  return extraout_RAX;
}

Assistant:

~times()
    {
        os << "Elapsed time: " << std::setprecision(1) << total.elapsed_seconds() << " s\n";
    }